

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_helper.h
# Opt level: O0

uint spdlog::details::fmt_helper::count_digits<unsigned_int>(uint n)

{
  uint uVar1;
  uint32_t in_EDI;
  
  uVar1 = fmt::v9::detail::count_digits(in_EDI);
  return uVar1;
}

Assistant:

inline unsigned int count_digits(T n) {
    using count_type =
        typename std::conditional<(sizeof(T) > sizeof(uint32_t)), uint64_t, uint32_t>::type;
#ifdef SPDLOG_USE_STD_FORMAT
    return count_digits_fallback(static_cast<count_type>(n));
#else
    return static_cast<unsigned int>(fmt::
    // fmt 7.0.0 renamed the internal namespace to detail.
    // See: https://github.com/fmtlib/fmt/issues/1538
    #if FMT_VERSION < 70000
                                         internal
    #else
                                         detail
    #endif
                                     ::count_digits(static_cast<count_type>(n)));
#endif
}